

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

char * method_name(int method)

{
  char *pcStack_10;
  int method_local;
  
  if (method == 0) {
    pcStack_10 = "Stored";
  }
  else if (method == 8) {
    pcStack_10 = "Deflate";
  }
  else if (method == 0xe) {
    pcStack_10 = "LZMA";
  }
  else if (method == 0x62) {
    pcStack_10 = "PPMd";
  }
  else if (method == 0xc) {
    pcStack_10 = "BZip2";
  }
  else {
    sprintf(method_name::unkn,"Unk:%03d",(ulong)(uint)method);
    pcStack_10 = method_name::unkn;
  }
  return pcStack_10;
}

Assistant:

const char *method_name(int method)
{
	static char unkn[16];

	if (method == METHOD_STORED)
	{
		return "Stored";
	}
	if (method == METHOD_DEFLATE)
	{
		return "Deflate";
	}
	if (method == METHOD_LZMA)
	{
		return "LZMA";
	}
	if (method == METHOD_PPMD)
	{
		return "PPMd";
	}
	if (method == METHOD_BZIP2)
	{
		return "BZip2";
	}
	sprintf(unkn, "Unk:%03d", method);
	return unkn;
}